

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O0

void __thiscall cppcms::widgets::numeric<double>::numeric(numeric<double> *this)

{
  base_html_input *in_RDI;
  allocator local_29;
  string local_28 [40];
  
  cppcms::widgets::base_widget::base_widget((base_widget *)&in_RDI->field_0x70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"text",&local_29);
  cppcms::widgets::base_html_input::base_html_input
            (in_RDI,(string *)&PTR_construction_vtable_24__0015a588);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  in_RDI->_vptr_base_html_input = (_func_int **)0x15a4a0;
  *(undefined8 *)&in_RDI->field_0x70 = 0x15a530;
  in_RDI->field_0x48 = 0;
  in_RDI->field_0x49 = 0;
  in_RDI->field_0x4a = 0;
  std::__cxx11::string::string((string *)&in_RDI->field_0x50);
  return;
}

Assistant:

numeric() :
				base_html_input("text"),
				check_low_(false),
				check_high_(false),
				non_empty_(false)
			{
			}